

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void PrintMiscActorInfo(AActor *query)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int style;
  long lVar5;
  FLineSpecial *pFVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  
  if (query == (AActor *)0x0) {
    return;
  }
  lVar5 = 0;
  uVar8 = 0xe;
  do {
    if (lVar5 == 0xe) {
LAB_00430479:
      pFVar6 = P_GetLineSpecialInfo(query->special);
      pcVar7 = AActor::GetTag(query,(char *)0x0);
      Printf("%s @ %p has the following flags:\n   flags: %x",pcVar7,query,
             (ulong)(query->flags).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1bc);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags2: %x",(ulong)(query->flags2).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags2).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1c0);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags3: %x",(ulong)(query->flags3).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags3).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1c4);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags4: %x",(ulong)(query->flags4).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags4).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1c8);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags5: %x",(ulong)(query->flags5).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags5).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1cc);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags6: %x",(ulong)(query->flags6).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags6).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1d0);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\n   flags7: %x",(ulong)(query->flags7).Value);
      for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
        if (((query->flags7).Value >> (uVar9 & 0x1f) & 1) != 0) {
          pcVar7 = GetFlagName(1 << ((byte)uVar9 & 0x1f),0x1d4);
          Printf(" %s",pcVar7);
        }
      }
      Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f",query->bouncefactor,
             query->wallbouncefactor,(ulong)(query->BounceFlags).Value);
      if (uVar8 < 0xe) {
        pcVar7 = _ZZ18PrintMiscActorInfoP6AActorE12renderstyles_rel +
                 *(int *)(_ZZ18PrintMiscActorInfoP6AActorE12renderstyles_rel + (ulong)uVar8 * 4);
      }
      else {
        pcVar7 = "Unknown";
      }
      Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x",query->Alpha,(ulong)uVar8,pcVar7,
             (ulong)(query->renderflags).Value);
      if (pFVar6 == (FLineSpecial *)0x0) {
        pcVar7 = "None";
      }
      else {
        pcVar7 = pFVar6->name;
      }
      Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",pcVar7,
             (ulong)(uint)query->args[0],(ulong)(uint)query->args[1],(ulong)(uint)query->args[2],
             (ulong)(uint)query->args[3],(ulong)(uint)query->args[4],(ulong)(uint)query->special1,
             (ulong)(uint)query->special2);
      Printf("\nTID: %d",(ulong)(uint)query->tid);
      Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",(query->__Pos).X,(query->__Pos).Y,
             (query->__Pos).Z,query->floorz,query->ceilingz);
      dVar1 = query->Speed;
      dVar2 = (query->Vel).X;
      dVar3 = (query->Vel).Y;
      dVar4 = (query->Vel).Z;
      dVar10 = TVector3<double>::Length(&query->Vel);
      Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",dVar1,dVar2,dVar3,dVar4,
             dVar10);
      Printf("Scale: x:%f, y:%f\n",(query->Scale).X,(query->Scale).Y);
      return;
    }
    if (LegacyRenderStyles[lVar5].AsDWORD == (query->RenderStyle).AsDWORD) {
      uVar8 = (uint)lVar5;
      goto LAB_00430479;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void PrintMiscActorInfo(AActor *query)
{
	if (query)
	{
		int flagi;
		int querystyle = STYLE_Count;
		for (int style = STYLE_None; style < STYLE_Count; ++style)
		{ // Check for a legacy render style that matches.
			if (LegacyRenderStyles[style] == query->RenderStyle)
			{
				querystyle = style;
				break;
			}
		}
		static const char * renderstyles[]= {"None", "Normal", "Fuzzy", "SoulTrans",
			"OptFuzzy", "Stencil", "Translucent", "Add", "Shaded", "TranslucentStencil",
			"Shadow", "Subtract", "AddStencil", "AddShaded"};

		FLineSpecial *spec = P_GetLineSpecialInfo(query->special);

		Printf("%s @ %p has the following flags:\n   flags: %x", query->GetTag(), query, query->flags.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags & ActorFlags::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags));
		Printf("\n   flags2: %x", query->flags2.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags2 & ActorFlags2::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags2));
		Printf("\n   flags3: %x", query->flags3.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags3 & ActorFlags3::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags3));
		Printf("\n   flags4: %x", query->flags4.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags4 & ActorFlags4::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags4));
		Printf("\n   flags5: %x", query->flags5.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags5 & ActorFlags5::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags5));
		Printf("\n   flags6: %x", query->flags6.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags6 & ActorFlags6::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags6));
		Printf("\n   flags7: %x", query->flags7.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags7 & ActorFlags7::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags7));
		Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f", 
			query->BounceFlags.GetValue(), query->bouncefactor,
			query->wallbouncefactor);
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->BounceFlags & 1<<flagi) Printf(" %s", flagnamesb[flagi]);*/
		Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x", 
			querystyle, (querystyle < STYLE_Count ? renderstyles[querystyle] : "Unknown"),
			query->Alpha, query->renderflags.GetValue());
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->renderflags & 1<<flagi) Printf(" %s", flagnamesr[flagi]);*/
		Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",
			(spec ? spec->name : "None"),
			query->args[0], query->args[1], query->args[2], query->args[3], 
			query->args[4],	query->special1, query->special2);
		Printf("\nTID: %d", query->tid);
		Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",
			query->X(), query->Y(), query->Z(),
			query->floorz, query->ceilingz);
		Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",
			query->Speed, query->Vel.X, query->Vel.Y, query->Vel.Z, query->Vel.Length());
		Printf("Scale: x:%f, y:%f\n", query->Scale.X, query->Scale.Y);
	}
}